

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_timer.hpp
# Opt level: O0

void __thiscall pico_tree::scoped_timer::~scoped_timer(scoped_timer *this)

{
  undefined8 uVar1;
  ostream *poVar2;
  string *in_RDI;
  rep_conflict rVar3;
  undefined1 auVar4 [16];
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff80;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff88;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff90;
  duration<double,_std::ratio<1L,_1L>_> local_10 [2];
  
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff90,&in_stack_ffffffffffffff88->__d);
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  poVar2 = std::operator<<(poVar2,in_RDI);
  poVar2 = std::operator<<(poVar2,"] Elapsed time: ");
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_10);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar3 * 1000.0);
  std::operator<<(poVar2," ms\n");
  if (1 < *(ulong *)(in_RDI + 0x28)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[");
    poVar2 = std::operator<<(poVar2,in_RDI);
    poVar2 = std::operator<<(poVar2,"] Average time: ");
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_10);
    uVar1 = *(undefined8 *)(in_RDI + 0x28);
    auVar4._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(rVar3 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,(int)uVar1) -
                                        4503599627370496.0))) * 1000.0);
    std::operator<<(poVar2," ms\n");
  }
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

~scoped_timer() {
    std::chrono::duration<double> elapsed_seconds =
        std::chrono::high_resolution_clock::now() - start_;
    std::cout << "[" << name_
              << "] Elapsed time: " << (elapsed_seconds.count() * 1000.0)
              << " ms\n";

    if (times_ > 1) {
      std::cout << "[" << name_ << "] Average time: "
                << ((elapsed_seconds.count() / static_cast<double>(times_)) *
                    1000.0)
                << " ms\n";
    }
  }